

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_serpent.cpp
# Opt level: O2

int AF_A_SerpentCheckForAttack
              (VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  int iVar3;
  AActor *pAVar4;
  FState *newstate;
  AActor *this_00;
  char *pcVar5;
  FName *this_01;
  FName FStack_28;
  FName local_24;
  FName local_20;
  FName local_1c;
  
  this_01 = &FStack_28;
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_00542df6;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_00542de6;
  this_00 = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (this_00 == (AActor *)0x0) goto LAB_00542cb3;
    bVar2 = DObject::IsKindOf((DObject *)this_00,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00542df6;
    }
  }
  else {
    if (this_00 != (AActor *)0x0) goto LAB_00542de6;
LAB_00542cb3:
    this_00 = (AActor *)0x0;
  }
  if (numparam == 1) goto LAB_00542d33;
  VVar1 = param[1].field_0.field_3.Type;
  if (VVar1 != 0xff) {
    if (VVar1 != '\x03') {
LAB_00542de6:
      pcVar5 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_00542df6;
    }
    this = (DObject *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if ((this != (DObject *)0x0) &&
         (bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar2)) {
        pcVar5 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_00542df6;
      }
    }
    else if (this != (DObject *)0x0) goto LAB_00542de6;
  }
  if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
     ((VVar1 == '\x03' &&
      ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_00542d33:
    pAVar4 = GC::ReadBarrier<AActor>((AActor **)&this_00->target);
    if (pAVar4 == (AActor *)0x0) {
      return 0;
    }
    if ((this_00->MissileState == (FState *)0x0) ||
       (bVar2 = AActor::CheckMeleeRange(this_00), bVar2)) {
      bVar2 = P_CheckMeleeRange2(this_00);
      if (bVar2) {
        pcVar5 = "Walk";
        this_01 = &local_20;
      }
      else {
        bVar2 = AActor::CheckMeleeRange(this_00);
        if (!bVar2) {
          return 0;
        }
        iVar3 = FRandom::operator()(&pr_serpentattack);
        if (iVar3 < 0x20) {
          pcVar5 = "Walk";
          this_01 = &local_24;
        }
        else {
          pcVar5 = "Attack";
        }
      }
    }
    else {
      pcVar5 = "Attack";
      this_01 = &local_1c;
    }
    FName::FName(this_01,pcVar5);
    newstate = AActor::FindState(this_00,this_01);
    AActor::SetState(this_00,newstate,false);
    return 0;
  }
  pcVar5 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
  ;
LAB_00542df6:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_serpent.cpp"
                ,0x82,
                "int AF_A_SerpentCheckForAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SerpentCheckForAttack)
{
	PARAM_ACTION_PROLOGUE;

	if (!self->target)
	{
		return 0;
	}
	if (self->MissileState != NULL)
	{
		if (!self->CheckMeleeRange ())
		{
			self->SetState (self->FindState ("Attack"));
			return 0;
		}
	}
	if (P_CheckMeleeRange2 (self))
	{
		self->SetState (self->FindState ("Walk"));
	}
	else if (self->CheckMeleeRange ())
	{
		if (pr_serpentattack() < 32)
		{
			self->SetState (self->FindState ("Walk"));
		}
		else
		{
			self->SetState (self->FindState ("Attack"));
		}
	}
	return 0;
}